

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.h
# Opt level: O1

int32_t __thiscall CVmObjStringBuffer::utf8_length(CVmObjStringBuffer *this)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  
  piVar3 = (int *)(this->super_CVmObject).ext_;
  iVar4 = *piVar3;
  if (0 < iVar4) {
    piVar3 = piVar3 + 3;
    iVar4 = iVar4 + 1;
    iVar2 = 0;
    do {
      uVar1 = *piVar3 < 0x800 ^ 3;
      if (*piVar3 < 0x80) {
        uVar1 = 1;
      }
      iVar2 = iVar2 + uVar1;
      piVar3 = piVar3 + 1;
      iVar4 = iVar4 + -1;
    } while (1 < iVar4);
    return iVar2;
  }
  return 0;
}

Assistant:

vm_strbuf_ext *get_ext() const { return (vm_strbuf_ext *)ext_; }